

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void google::protobuf::internal::MapMergeFrom<int,google::protobuf::Empty>
               (Map<int,_google::protobuf::Empty> *dest,Map<int,_google::protobuf::Empty> *src)

{
  NodeBase *pNVar1;
  uint uVar2;
  ulong uVar3;
  pair<google::protobuf::Map<int,_google::protobuf::Empty>::iterator,_bool> local_50;
  
  uVar2 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar3 = (ulong)uVar2;
  if (uVar2 == (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    return;
  }
  pNVar1 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar3];
  if (pNVar1 != (NodeBase *)0x0) {
    do {
      do {
        Map<int,google::protobuf::Empty>::TryEmplaceInternal<int_const&>
                  (&local_50,dest,(int *)(pNVar1 + 1));
        ZeroFieldsBase::CopyImpl
                  ((Message *)(local_50.first.super_UntypedMapIterator.node_ + 2),
                   (Message *)(pNVar1 + 2));
        pNVar1 = pNVar1->next;
      } while (pNVar1 != (NodeBase *)0x0);
      do {
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
        if ((src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar2) {
          return;
        }
        pNVar1 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar2];
      } while (pNVar1 == (NodeBase *)0x0);
    } while( true );
  }
  protobuf_assumption_failed
            ("node != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x22e);
}

Assistant:

inline UntypedMapIterator UntypedMapBase::begin() const {
  map_index_t bucket_index;
  NodeBase* node;
  if (index_of_first_non_null_ == num_buckets_) {
    bucket_index = 0;
    node = nullptr;
  } else {
    bucket_index = index_of_first_non_null_;
    node = table_[bucket_index];
    PROTOBUF_ASSUME(node != nullptr);
  }
  return UntypedMapIterator{node, this, bucket_index};
}